

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::SetLanguageStandardProperty(cmTarget *this,string *lang,string *value,string *feature)

{
  bool bVar1;
  __type _Var2;
  pointer pcVar3;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  mapped_type *__lhs;
  string local_80;
  mapped_type *local_60;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *languageStandardProperty;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry;
  iterator __end1;
  iterator __begin1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  cmListFileBacktrace featureBacktrace;
  string *feature_local;
  string *value_local;
  string *lang_local;
  cmTarget *this_local;
  
  featureBacktrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)feature;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range1);
  pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  this_00 = &(pcVar3->CompileFeatures).Entries;
  __end1 = std::
           vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(this_00);
  entry = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(this_00);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&entry);
    if (!bVar1) {
LAB_00948926:
      pcVar3 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
               operator->(&this->impl);
      cmStrCat<std::__cxx11::string_const&,char_const(&)[10]>
                (&local_80,lang,(char (*) [10])0xfed3a0);
      __lhs = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&pcVar3->LanguageStandardProperties,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      local_60 = __lhs;
      bVar1 = std::operator!=(&__lhs->Value,value);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_60,(string *)value);
        std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::clear
                  (&local_60->Backtraces);
      }
      std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
      emplace_back<cmListFileBacktrace&>
                ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)
                 &local_60->Backtraces,(cmListFileBacktrace *)&__range1);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range1);
      return;
    }
    languageStandardProperty =
         (BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         __gnu_cxx::
         __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::operator*(&__end1);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            languageStandardProperty,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            featureBacktrace.
                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
    if (_Var2) {
      cmListFileBacktrace::operator=
                ((cmListFileBacktrace *)&__range1,
                 (cmListFileBacktrace *)&languageStandardProperty->Backtraces);
      goto LAB_00948926;
    }
    __gnu_cxx::
    __normal_iterator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmTarget::SetLanguageStandardProperty(std::string const& lang,
                                           std::string const& value,
                                           const std::string& feature)
{
  cmListFileBacktrace featureBacktrace;
  for (auto const& entry : this->impl->CompileFeatures.Entries) {
    if (entry.Value == feature) {
      featureBacktrace = entry.Backtrace;
      break;
    }
  }

  BTs<std::string>& languageStandardProperty =
    this->impl->LanguageStandardProperties[cmStrCat(lang, "_STANDARD")];
  if (languageStandardProperty.Value != value) {
    languageStandardProperty.Value = value;
    languageStandardProperty.Backtraces.clear();
  }
  languageStandardProperty.Backtraces.emplace_back(featureBacktrace);
}